

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O1

void setarg(ident *id,tagval *v)

{
  anon_union_8_3_558327c1_for_ident_6 *paVar1;
  uint *puVar2;
  
  if (((uint)aliasstack->usedargs >> (id->index & 0x1fU) & 1) == 0) {
    paVar1 = (anon_union_8_3_558327c1_for_ident_6 *)(aliasstack->argstack + id->index);
    *paVar1 = id->field_4;
    *(anon_union_4_3_c060dbb1_for_ident_2 *)(paVar1 + 1) = id->field_2;
    paVar1[2] = *(anon_union_8_3_558327c1_for_ident_6 *)&id->field_5;
    (id->field_5).stack = (identstack *)paVar1;
    id->field_2 = (anon_union_4_3_c060dbb1_for_ident_2)v->type;
    (id->field_4).val.field_0 = (v->super_identval).field_0;
    puVar2 = (id->field_3).code;
    if (puVar2 != (uint *)0x0) {
      *puVar2 = *puVar2 - 0x100;
      if ((int)*(id->field_3).code < 0x100) {
        operator_delete__((id->field_3).code);
      }
      (id->field_3).code = (uint *)0x0;
    }
    aliasstack->usedargs = aliasstack->usedargs | 1 << ((byte)id->index & 0x1f);
  }
  else {
    if (((id->field_2).minval == 3) && ((id->field_4).args != (char *)0x0)) {
      operator_delete__((id->field_4).args);
    }
    id->field_2 = (anon_union_4_3_c060dbb1_for_ident_2)v->type;
    (id->field_4).val.field_0 = (v->super_identval).field_0;
    puVar2 = (id->field_3).code;
    if (puVar2 != (uint *)0x0) {
      *puVar2 = *puVar2 - 0x100;
      if ((int)*(id->field_3).code < 0x100) {
        operator_delete__((id->field_3).code);
      }
      (id->field_3).code = (uint *)0x0;
    }
  }
  return;
}

Assistant:

static inline void setarg(ident &id, tagval &v)
{
    if(aliasstack->usedargs&(1<<id.index))
    {
        if(id.valtype == VAL_STR) delete[] id.val.s;
        id.setval(v);
        cleancode(id);
    }
    else
    {
        pusharg(id, v, aliasstack->argstack[id.index]);
        aliasstack->usedargs |= 1<<id.index;
    }
}